

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffgi1b(fitsfile *fptr,LONGLONG byteloc,long nvals,long incre,uchar *values,int *status)

{
  undefined8 uVar1;
  long in_RCX;
  fitsfile *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  int *in_R9;
  LONGLONG postemp;
  fitsfile *in_stack_00000038;
  int err_mode;
  
  err_mode = (int)((ulong)in_R8 >> 0x20);
  if (in_RCX == 1) {
    if ((long)in_RDX < 0x21c0) {
      ffmbyt(in_RDX,1,err_mode,in_R9);
      ffgbyt((fitsfile *)byteloc,nvals,(void *)incre,(int *)values);
    }
    else {
      uVar1 = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x40);
      *(undefined8 *)(*(long *)(in_RDI + 8) + 0x40) = in_RSI;
      ffgbyt((fitsfile *)byteloc,nvals,(void *)incre,(int *)values);
      *(undefined8 *)(*(long *)(in_RDI + 8) + 0x40) = uVar1;
    }
  }
  else {
    ffmbyt(in_RDX,in_RCX,err_mode,in_R9);
    ffgbytoff(in_stack_00000038,(long)fptr,byteloc,nvals,(void *)incre,(int *)values);
  }
  return *in_R9;
}

Assistant:

int ffgi1b(fitsfile *fptr, /* I - FITS file pointer                         */
           LONGLONG byteloc,  /* I - position within file to start reading     */
           long nvals,     /* I - number of pixels to read                  */
           long incre,     /* I - byte increment between pixels             */
           unsigned char *values, /* O - returned array of values           */
           int *status)    /* IO - error status                             */
/*
  get (read) the array of values from the FITS file, doing machine dependent
  format conversion (e.g. byte-swapping) if necessary.
*/
{
    LONGLONG postemp;

    if (incre == 1)      /* read all the values at once (contiguous bytes) */
    {
        if (nvals < MINDIRECT)  /* read normally via IO buffers */
        {
           ffmbyt(fptr, byteloc, REPORT_EOF, status);
           ffgbyt(fptr, nvals, values, status);
        }
        else            /* read directly from disk, bypassing IO buffers */
        {
           postemp = (fptr->Fptr)->bytepos;   /* store current file position */
           (fptr->Fptr)->bytepos = byteloc;   /* set to the desired position */
           ffgbyt(fptr, nvals, values, status);
           (fptr->Fptr)->bytepos = postemp;   /* reset to original position */
        }
    }
    else         /* have to read each value individually (not contiguous ) */
    {
        ffmbyt(fptr, byteloc, REPORT_EOF, status);
        ffgbytoff(fptr, 1, nvals, incre - 1, values, status);
    }
    return(*status);
}